

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_lexer.c
# Opt level: O0

gtoken_t lexer_scan_number(gravity_lexer_t *lexer)

{
  _Bool _Var1;
  int iVar2;
  gtoken_t gVar3;
  gtoken_s *__dest;
  int local_7c;
  int local_6c;
  int local_68;
  int local_64;
  undefined1 local_60 [40];
  gravity_number_type local_38;
  int local_34;
  gravity_number_type ntype;
  int minusSign;
  int plusSign;
  int floatChar;
  int expChar;
  int c;
  _Bool expFound;
  _Bool dotFound;
  _Bool signAllowed;
  _Bool expAllowed;
  gravity_lexer_t *pgStack_18;
  _Bool floatAllowed;
  gravity_lexer_t *lexer_local;
  
  c._3_1_ = 1;
  c._2_1_ = 1;
  c._1_1_ = 0;
  c._0_1_ = 0;
  expChar._3_1_ = 0;
  plusSign = 0x65;
  minusSign = 0x2e;
  ntype = 0x2b;
  local_34 = 0x2d;
  local_38 = NUMBER_INTEGER;
  pgStack_18 = lexer;
  if (lexer->buffer[lexer->offset] == '0') {
    if (lexer->offset < lexer->length) {
      local_64 = (int)lexer->buffer[lexer->offset + 1];
    }
    else {
      local_64 = 0;
    }
    iVar2 = toupper(local_64);
    if (iVar2 == 0x58) {
      local_38 = NUMBER_HEX;
      c._3_1_ = 0;
      c._2_1_ = 0;
    }
    else {
      if (pgStack_18->offset < pgStack_18->length) {
        local_68 = (int)pgStack_18->buffer[pgStack_18->offset + 1];
      }
      else {
        local_68 = 0;
      }
      iVar2 = toupper(local_68);
      if (iVar2 == 0x42) {
        local_38 = NUMBER_BIN;
        c._3_1_ = 0;
        c._2_1_ = 0;
      }
      else {
        if (pgStack_18->offset < pgStack_18->length) {
          local_6c = (int)pgStack_18->buffer[pgStack_18->offset + 1];
        }
        else {
          local_6c = 0;
        }
        iVar2 = toupper(local_6c);
        if (iVar2 == 0x4f) {
          local_38 = NUMBER_OCT;
          c._3_1_ = 0;
          c._2_1_ = 0;
        }
      }
    }
  }
  __dest = &pgStack_18->token;
  memset(local_60,0,0x28);
  memcpy(__dest,local_60,0x28);
  (pgStack_18->token).position = pgStack_18->position;
  (pgStack_18->token).value = pgStack_18->buffer + pgStack_18->offset;
  (pgStack_18->token).lineno = pgStack_18->lineno;
  (pgStack_18->token).colno = pgStack_18->colno;
  (pgStack_18->token).builtin = BUILTIN_NONE;
  if (local_38 != NUMBER_INTEGER) {
    (pgStack_18->token).bytes = (pgStack_18->token).bytes + 1;
    (pgStack_18->token).length = (pgStack_18->token).length + 1;
    (pgStack_18->token).bytes = (pgStack_18->token).bytes + 1;
    (pgStack_18->token).length = (pgStack_18->token).length + 1;
    pgStack_18->offset = pgStack_18->offset + 1;
    pgStack_18->colno = pgStack_18->colno + 1;
    pgStack_18->position = pgStack_18->position + 1;
    pgStack_18->offset = pgStack_18->offset + 1;
    pgStack_18->colno = pgStack_18->colno + 1;
    pgStack_18->position = pgStack_18->position + 1;
  }
  do {
    floatChar = (int)pgStack_18->buffer[pgStack_18->offset];
    if (pgStack_18->length <= pgStack_18->offset) {
LAB_0011c633:
      (pgStack_18->token).type = TOK_NUMBER;
      (pgStack_18->token).fileid = pgStack_18->fileid;
      return TOK_NUMBER;
    }
    _Var1 = is_digit(floatChar,local_38);
    if (!_Var1) {
      _Var1 = is_whitespace(floatChar);
      if ((_Var1) || (_Var1 = is_newline(pgStack_18,floatChar), _Var1)) goto LAB_0011c633;
      if (((c._2_1_ & 1) == 0) || ((floatChar != plusSign || ((expChar._3_1_ & 1) != 0)))) {
        if ((c._3_1_ & 1) != 0) {
          if (floatChar == minusSign) {
            if (pgStack_18->offset < pgStack_18->length) {
              local_7c = (int)pgStack_18->buffer[pgStack_18->offset + 1];
            }
            else {
              local_7c = 0;
            }
            _Var1 = is_digit(local_7c,local_38);
            if (!_Var1) goto LAB_0011c633;
          }
          if ((floatChar == minusSign) && (((byte)c & 1) == 0)) {
            c._0_1_ = 1;
            goto LAB_0011c5ed;
          }
        }
        if (((c._1_1_ & 1) == 0) || ((floatChar != ntype && (floatChar != local_34)))) {
          _Var1 = is_builtin_operator(floatChar);
          if ((!_Var1) && (_Var1 = is_semicolon(floatChar), !_Var1)) {
            gVar3 = lexer_error(pgStack_18,"Malformed number expression.");
            return gVar3;
          }
          goto LAB_0011c633;
        }
        c._1_1_ = 0;
      }
      else {
        expChar._3_1_ = 1;
        c._1_1_ = 1;
      }
    }
LAB_0011c5ed:
    (pgStack_18->token).bytes = (pgStack_18->token).bytes + 1;
    (pgStack_18->token).length = (pgStack_18->token).length + 1;
    pgStack_18->offset = pgStack_18->offset + 1;
    pgStack_18->colno = pgStack_18->colno + 1;
    pgStack_18->position = pgStack_18->position + 1;
  } while( true );
}

Assistant:

static gtoken_t lexer_scan_number(gravity_lexer_t *lexer) {
    bool        floatAllowed = true;
    bool        expAllowed = true;
    bool        signAllowed = false;
    bool        dotFound = false;
    bool        expFound = false;
    int            c, expChar = 'e', floatChar = '.';
    int            plusSign = '+', minusSign = '-';

    gravity_number_type    ntype = NUMBER_INTEGER;
    if (PEEK_CURRENT == '0') {
        if (toupper(PEEK_NEXT) == 'X') {ntype = NUMBER_HEX; floatAllowed = false; expAllowed = false;}
        else if (toupper(PEEK_NEXT) == 'B') {ntype = NUMBER_BIN; floatAllowed = false; expAllowed = false;}
        else if (toupper(PEEK_NEXT) == 'O') {ntype = NUMBER_OCT; floatAllowed = false; expAllowed = false;}
    }

    TOKEN_RESET;
    if (ntype != NUMBER_INTEGER) {
        // skip first 0* number marker
        INC_TOKLEN;
        INC_TOKLEN;
        INC_OFFSET_POSITION;
        INC_OFFSET_POSITION;
    }

    // supported exp formats:
    // 12345    // decimal
    // 3.1415    // float
    // 1.25e2 = 1.25 * 10^2 = 125.0        // scientific notation
    // 1.25e-2 = 1.25 * 10^-2 = 0.0125    // scientific notation
    // 0xFFFF    // hex
    // 0B0101    // binary
    // 0O7777    // octal

loop:
    c = PEEK_CURRENT;

    // explicitly list all accepted cases
    if (IS_EOF) goto report_token;
    if (is_digit(c, ntype)) goto accept_char;
    if (is_whitespace(c)) goto report_token;
    if (is_newline(lexer, c)) goto report_token;

    if (expAllowed) {
        if ((c == expChar) && (!expFound)) {expFound = true; signAllowed = true; goto accept_char;}
    }
    if (floatAllowed) {
        if ((c == floatChar) && (!is_digit(PEEK_NEXT, ntype))) goto report_token;
        if ((c == floatChar) && (!dotFound))  {dotFound = true; goto accept_char;}
    }
    if (signAllowed) {
        if ((c == plusSign) || (c == minusSign)) {signAllowed = false; goto accept_char;}
    }
    if (is_builtin_operator(c)) goto report_token;
    if (is_semicolon(c)) goto report_token;

    // any other case is an error
    goto report_error;

accept_char:
    INC_TOKLEN;
    INC_OFFSET_POSITION;
    goto loop;

report_token:
    // number is from buffer->[nseek] and it is bytes length
    TOKEN_FINALIZE(TOK_NUMBER);

    DEBUG_LEXEM("Found number: %.*s", TOKEN_BYTES(lexer->token), TOKEN_VALUE(lexer->token));
    return TOK_NUMBER;

report_error:
    return lexer_error(lexer, "Malformed number expression.");
}